

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAbstractAnimationPrivate::setState(QAbstractAnimationPrivate *this,State newState)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  parameter_type pVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  parameter_type pVar8;
  parameter_type pVar9;
  parameter_type pVar10;
  parameter_type pVar11;
  parameter_type pVar12;
  int iVar13;
  int iVar14;
  QAbstractAnimation *pQVar15;
  parameter_type in_ESI;
  QAbstractAnimationPrivate *in_RDI;
  long in_FS_OFFSET;
  int dura;
  bool isTopLevel;
  int oldTotalCurrentTime;
  Direction oldDirection;
  int oldCurrentLoop;
  int oldCurrentTime;
  State oldState;
  QAbstractAnimation *q;
  QPointer<QAbstractAnimation> guard;
  State in_stack_ffffffffffffff48;
  State in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  State in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar16;
  uint uVar17;
  int local_70;
  int local_6c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar15 = q_func(in_RDI);
  pVar4 = QPropertyData<QAbstractAnimation::State>::valueBypassingBindings
                    (&(in_RDI->state).super_QPropertyData<QAbstractAnimation::State>);
  if ((pVar4 == in_ESI) ||
     (pVar5 = QObjectBindableProperty::operator_cast_to_int
                        ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                          *)0x66aeb0), pVar5 == 0)) goto LAB_0066b33a;
  iVar1 = in_RDI->currentTime;
  pVar6 = ::QObjectCompatProperty::operator_cast_to_int
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
                      *)0x66aed8);
  pVar7 = ::QObjectCompatProperty::operator_cast_to_Direction
                    ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                      *)0x66aeea);
  if (((in_ESI == Paused) || (in_ESI == Running)) && (pVar4 == Stopped)) {
    pVar8 = ::QObjectCompatProperty::operator_cast_to_int
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                        *)0x66af25);
    pVar9 = ::QObjectCompatProperty::operator_cast_to_Direction
                      ((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                        *)0x66af37);
    if (pVar9 == Forward) {
      local_6c = 0;
    }
    else {
      pVar5 = QObjectBindableProperty::operator_cast_to_int
                        ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                          *)0x66af55);
      if (pVar5 == -1) {
        local_70 = (*(pQVar15->super_QObject)._vptr_QObject[0xc])();
      }
      else {
        local_70 = QAbstractAnimation::totalDuration
                             ((QAbstractAnimation *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      local_6c = local_70;
    }
    in_RDI->currentTime = local_6c;
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::operator=((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                in_stack_ffffffffffffff4c);
    pVar10 = ::QObjectCompatProperty::operator_cast_to_int
                       ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                         *)0x66afb3);
    if (pVar10 != pVar8) {
      QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
      ::notify((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                *)CONCAT44(pVar6,pVar7));
    }
  }
  QPropertyData<QAbstractAnimation::State>::setValueBypassingBindings
            (&(in_RDI->state).super_QPropertyData<QAbstractAnimation::State>,in_ESI);
  QPointer<QAbstractAnimation>::QPointer<void>
            ((QPointer<QAbstractAnimation> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar16 = CONCAT13(1,(int3)in_stack_ffffffffffffff8c);
  if (in_RDI->group != (QAnimationGroup *)0x0) {
    in_stack_ffffffffffffff88 =
         QAbstractAnimation::state
                   ((QAbstractAnimation *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    uVar16 = CONCAT13(in_stack_ffffffffffffff88 == Stopped,(int3)uVar16);
  }
  uVar17 = uVar16;
  if (pVar4 == Running) {
    if ((in_ESI == Paused) && ((in_RDI->hasRegisteredTimer & 1U) != 0)) {
      QAnimationTimer::ensureTimerUpdate();
    }
    QAnimationTimer::unregisterAnimation
              ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  else if (in_ESI == Running) {
    QAnimationTimer::registerAnimation
              ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
  }
  (*(pQVar15->super_QObject)._vptr_QObject[0xe])(pQVar15,(ulong)in_ESI,(ulong)pVar4);
  bVar3 = QPointer::operator_cast_to_bool((QPointer<QAbstractAnimation> *)0x66b10b);
  if ((bVar3) &&
     (pVar11 = QPropertyData<QAbstractAnimation::State>::valueBypassingBindings
                         (&(in_RDI->state).super_QPropertyData<QAbstractAnimation::State>),
     in_ESI == pVar11)) {
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
              *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    QAbstractAnimation::stateChanged
              ((QAbstractAnimation *)0x66b174,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    bVar3 = QPointer::operator_cast_to_bool((QPointer<QAbstractAnimation> *)0x66b183);
    if ((bVar3) &&
       (pVar11 = QPropertyData<QAbstractAnimation::State>::valueBypassingBindings
                           (&(in_RDI->state).super_QPropertyData<QAbstractAnimation::State>),
       in_ESI == pVar11)) {
      pVar12 = QObjectBindableProperty::operator_cast_to_State
                         ((QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
                           *)0x66b1cf);
      if (pVar12 == Stopped) {
        iVar13 = (*(pQVar15->super_QObject)._vptr_QObject[0xc])();
        if ((in_RDI->deleteWhenStopped & 1U) != 0) {
          QObject::deleteLater((QObject *)CONCAT44(iVar13,in_stack_ffffffffffffffa0));
        }
        if ((iVar13 != -1) &&
           (pVar5 = QObjectBindableProperty::operator_cast_to_int
                              ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                                *)0x66b2a5), -1 < pVar5)) {
          if (pVar7 == Forward) {
            iVar14 = iVar1 * (pVar6 + 1);
            pVar5 = QObjectBindableProperty::operator_cast_to_int
                              ((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                                *)0x66b2e8);
            if (iVar14 == iVar13 * pVar5) goto LAB_0066b312;
          }
          if ((pVar7 != Backward) || (iVar1 != 0)) goto LAB_0066b32d;
        }
LAB_0066b312:
        QAbstractAnimation::finished((QAbstractAnimation *)0x66b31f);
      }
      else if ((((pVar12 != Paused) && (pVar12 == Running)) && (pVar4 == Stopped)) &&
              ((uVar16 & 0x1000000) != 0)) {
        QAnimationTimer::ensureTimerUpdate();
        ::QObjectCompatProperty::operator_cast_to_int
                  ((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                    *)0x66b230);
        QAbstractAnimation::setCurrentTime
                  ((QAbstractAnimation *)CONCAT44(uVar17,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffffac);
      }
    }
  }
LAB_0066b32d:
  QPointer<QAbstractAnimation>::~QPointer((QPointer<QAbstractAnimation> *)0x66b33a);
LAB_0066b33a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractAnimationPrivate::setState(QAbstractAnimation::State newState)
{
    Q_Q(QAbstractAnimation);
    const QAbstractAnimation::State oldState = state.valueBypassingBindings();
    if (oldState == newState)
        return;

    if (loopCount == 0)
        return;

    int oldCurrentTime = currentTime;
    int oldCurrentLoop = currentLoop;
    QAbstractAnimation::Direction oldDirection = direction;

    // check if we should Rewind
    if ((newState == QAbstractAnimation::Paused || newState == QAbstractAnimation::Running)
        && oldState == QAbstractAnimation::Stopped) {
            const int oldTotalCurrentTime = totalCurrentTime;
            //here we reset the time if needed
            //we don't call setCurrentTime because this might change the way the animation
            //behaves: changing the state or changing the current value
            totalCurrentTime = currentTime = (direction == QAbstractAnimation::Forward) ?
                0 : (loopCount == -1 ? q->duration() : q->totalDuration());
            if (totalCurrentTime != oldTotalCurrentTime)
                totalCurrentTime.notify();
    }

    state.setValueBypassingBindings(newState);
    QPointer<QAbstractAnimation> guard(q);

    //(un)registration of the animation must always happen before calls to
    //virtual function (updateState) to ensure a correct state of the timer
    bool isTopLevel = !group || group->state() == QAbstractAnimation::Stopped;
    if (oldState == QAbstractAnimation::Running) {
        if (newState == QAbstractAnimation::Paused && hasRegisteredTimer)
            QAnimationTimer::ensureTimerUpdate();
        //the animation, is not running any more
        QAnimationTimer::unregisterAnimation(q);
    } else if (newState == QAbstractAnimation::Running) {
        QAnimationTimer::registerAnimation(q, isTopLevel);
    }

    q->updateState(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    // Notify state change
    state.notify();
    emit q->stateChanged(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    switch (state) {
    case QAbstractAnimation::Paused:
        break;
    case QAbstractAnimation::Running:
        {

            // this ensures that the value is updated now that the animation is running
            if (oldState == QAbstractAnimation::Stopped) {
                if (isTopLevel) {
                    // currentTime needs to be updated if pauseTimer is active
                    QAnimationTimer::ensureTimerUpdate();
                    q->setCurrentTime(totalCurrentTime);
                }
            }
        }
        break;
    case QAbstractAnimation::Stopped:
        // Leave running state.
        int dura = q->duration();

        if (deleteWhenStopped)
            q->deleteLater();

        if (dura == -1 || loopCount < 0
            || (oldDirection == QAbstractAnimation::Forward && (oldCurrentTime * (oldCurrentLoop + 1)) == (dura * loopCount))
            || (oldDirection == QAbstractAnimation::Backward && oldCurrentTime == 0)) {
                emit q->finished();
        }
        break;
    }
}